

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall Generator::generateMetacall(Generator *this)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  qsizetype qVar4;
  ulong uVar5;
  QList<FunctionDef> *in_RDI;
  long in_FS_OFFSET;
  bool isQObject;
  QList<FunctionDef> methodList;
  QByteArray superClass;
  QList<FunctionDef> *in_stack_ffffffffffffff58;
  QList<FunctionDef> *in_stack_ffffffffffffff60;
  FILE *pFVar6;
  char **in_stack_ffffffffffffff68;
  QByteArray *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffffa8;
  QList<FunctionDef> local_40;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = "QObject";
  bVar1 = ::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pFVar6 = (FILE *)(in_RDI->d).ptr;
  pcVar3 = QByteArray::constData((QByteArray *)0x10fa5f);
  fprintf(pFVar6,"\nint %s::qt_metacall(QMetaObject::Call _c, int _id, void **_a)\n{\n",pcVar3);
  bVar2 = QByteArray::isEmpty((QByteArray *)0x10fa83);
  if ((!bVar2) && ((bVar1 & 1) == 0)) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray
              ((QByteArray *)in_stack_ffffffffffffff60,(QByteArray *)in_stack_ffffffffffffff58);
    pFVar6 = (FILE *)(in_RDI->d).ptr;
    pcVar3 = QByteArray::constData((QByteArray *)0x10faf4);
    fprintf(pFVar6,"    _id = %s::qt_metacall(_c, _id, _a);\n",pcVar3);
    QByteArray::~QByteArray((QByteArray *)0x10fb17);
  }
  local_40.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d.ptr = (FunctionDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<FunctionDef>::QList((QList<FunctionDef> *)0x10fb45);
  QList<FunctionDef>::operator+=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  QList<FunctionDef>::operator+=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  QList<FunctionDef>::operator+=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  qVar4 = QList<FunctionDef>::size(&local_40);
  if (qVar4 == 0) {
    qVar4 = QList<PropertyDef>::size((QList<PropertyDef> *)((in_RDI->d).size + 0x188));
    if (qVar4 == 0) goto LAB_0010fbd5;
  }
  fprintf((FILE *)(in_RDI->d).ptr,"    if (_id < 0)\n        return _id;\n");
LAB_0010fbd5:
  qVar4 = QList<FunctionDef>::size(&local_40);
  if (qVar4 != 0) {
    fprintf((FILE *)(in_RDI->d).ptr,"    if (_c == QMetaObject::InvokeMetaMethod) {\n");
    pFVar6 = (FILE *)(in_RDI->d).ptr;
    uVar5 = QList<FunctionDef>::size(&local_40);
    fprintf(pFVar6,"        if (_id < %d)\n",uVar5 & 0xffffffff);
    fprintf((FILE *)(in_RDI->d).ptr,"            qt_static_metacall(this, _c, _id, _a);\n");
    pFVar6 = (FILE *)(in_RDI->d).ptr;
    uVar5 = QList<FunctionDef>::size(&local_40);
    fprintf(pFVar6,"        _id -= %d;\n    }\n",uVar5 & 0xffffffff);
    fprintf((FILE *)(in_RDI->d).ptr,"    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {\n"
           );
    pFVar6 = (FILE *)(in_RDI->d).ptr;
    uVar5 = QList<FunctionDef>::size(&local_40);
    fprintf(pFVar6,"        if (_id < %d)\n",uVar5 & 0xffffffff);
    methodsWithAutomaticTypesHelper((Generator *)CONCAT17(bVar1,in_stack_ffffffffffffffa8),in_RDI);
    bVar2 = QMap<int,_QMultiMap<QByteArray,_int>_>::isEmpty
                      ((QMap<int,_QMultiMap<QByteArray,_int>_> *)in_stack_ffffffffffffff60);
    QMap<int,_QMultiMap<QByteArray,_int>_>::~QMap
              ((QMap<int,_QMultiMap<QByteArray,_int>_> *)0x10fce1);
    if (bVar2) {
      fprintf((FILE *)(in_RDI->d).ptr,
              "            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();\n");
    }
    else {
      fprintf((FILE *)(in_RDI->d).ptr,"            qt_static_metacall(this, _c, _id, _a);\n");
    }
    pFVar6 = (FILE *)(in_RDI->d).ptr;
    uVar5 = QList<FunctionDef>::size(&local_40);
    fprintf(pFVar6,"        _id -= %d;\n    }\n",uVar5 & 0xffffffff);
  }
  qVar4 = QList<PropertyDef>::size((QList<PropertyDef> *)((in_RDI->d).size + 0x188));
  if (qVar4 != 0) {
    pFVar6 = (FILE *)(in_RDI->d).ptr;
    uVar5 = QList<PropertyDef>::size((QList<PropertyDef> *)((in_RDI->d).size + 0x188));
    fprintf(pFVar6,
            "    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty\n            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty\n            || _c == QMetaObject::RegisterPropertyMetaType) {\n        qt_static_metacall(this, _c, _id, _a);\n        _id -= %d;\n    }\n"
            ,uVar5 & 0xffffffff);
  }
  fprintf((FILE *)(in_RDI->d).ptr,"    return _id;\n}\n");
  QList<FunctionDef>::~QList((QList<FunctionDef> *)0x10fdb7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Generator::generateMetacall()
{
    bool isQObject = (cdef->classname == "QObject");

    fprintf(out, "\nint %s::qt_metacall(QMetaObject::Call _c, int _id, void **_a)\n{\n",
             cdef->qualified.constData());

    if (!purestSuperClass.isEmpty() && !isQObject) {
        QByteArray superClass = purestSuperClass;
        fprintf(out, "    _id = %s::qt_metacall(_c, _id, _a);\n", superClass.constData());
    }


    QList<FunctionDef> methodList;
    methodList += cdef->signalList;
    methodList += cdef->slotList;
    methodList += cdef->methodList;

    // If there are no methods or properties, we will return _id anyway, so
    // don't emit this comparison -- it is unnecessary, and it makes coverity
    // unhappy.
    if (methodList.size() || cdef->propertyList.size()) {
        fprintf(out, "    if (_id < 0)\n        return _id;\n");
    }

    if (methodList.size()) {
        fprintf(out, "    if (_c == QMetaObject::InvokeMetaMethod) {\n");
        fprintf(out, "        if (_id < %d)\n", int(methodList.size()));
        fprintf(out, "            qt_static_metacall(this, _c, _id, _a);\n");
        fprintf(out, "        _id -= %d;\n    }\n", int(methodList.size()));

        fprintf(out, "    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {\n");
        fprintf(out, "        if (_id < %d)\n", int(methodList.size()));

        if (methodsWithAutomaticTypesHelper(methodList).isEmpty())
            fprintf(out, "            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();\n");
        else
            fprintf(out, "            qt_static_metacall(this, _c, _id, _a);\n");
        fprintf(out, "        _id -= %d;\n    }\n", int(methodList.size()));

    }

    if (cdef->propertyList.size()) {
        fprintf(out,
            "    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty\n"
            "            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty\n"
            "            || _c == QMetaObject::RegisterPropertyMetaType) {\n"
            "        qt_static_metacall(this, _c, _id, _a);\n"
            "        _id -= %d;\n    }\n", int(cdef->propertyList.size()));
    }
    fprintf(out,"    return _id;\n}\n");
}